

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O0

void __thiscall
brown::Simulator::setpin
          (Simulator *this,int64_t clk,bool pulx,bool puly,bool dirx,bool diry,bool down)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int64_t t1;
  int64_t t0;
  int i;
  uint32_t delayTimeFloor;
  uint32_t elapsedTime;
  double delayTime;
  uint local_28;
  bool dir [2];
  bool pul [2];
  int y;
  int x;
  bool down_local;
  bool diry_local;
  bool dirx_local;
  bool puly_local;
  bool pulx_local;
  int64_t clk_local;
  Simulator *this_local;
  
  delayTime._6_1_ = pulx;
  delayTime._7_1_ = puly;
  delayTime._4_1_ = dirx;
  delayTime._5_1_ = diry;
  if ((clk < this->pclk) || (((clk == this->pclk && (!pulx)) && (!puly)))) {
    App::delay(this->app,0xf);
  }
  else {
    if ((ulong)(this->CLKFRQ / 10) < clk - setpin::startClk) {
      uVar1 = App::getTime(this->app);
      lVar5 = clk - setpin::startClk;
      auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar6._0_8_ = lVar5;
      auVar6._12_4_ = 0x45300000;
      uVar2 = (uint)(long)((((auVar6._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 1000.0
                           ) / (double)this->CLKFRQ + 0.0);
      if (uVar1 - setpin::startTime < uVar2) {
        App::delay(this->app,uVar2 - (uVar1 - setpin::startTime));
      }
      setpin::startClk = clk;
      setpin::startTime = App::getTime(this->app);
    }
    this->pclk = clk;
    if (this->fifn < this->FIFMAX) {
      this->fifclk[this->fifn] = clk;
      this->fifcurx[this->fifn] = this->acur[0];
      this->fifcury[this->fifn] = this->acur[1];
      this->fifbit[this->fifn] = pulx + puly * '\x02' + dirx * '\x04' + diry * '\b' + down * '\x10';
      this->fifn = this->fifn + 1;
    }
    _dir = (this->acur[0] >> 6) + (this->BMPXRES >> 1);
    local_28 = (this->acur[1] >> 6) + (this->BMPYRES >> 1);
    if ((_dir < (uint)this->BMPXRES) && (local_28 < (uint)this->BMPYRES)) {
      if (down) {
        puVar3 = Tile::getpix(&this->drawing,_dir,local_28);
        *puVar3 = 0xd0c0b0;
      }
      else {
        puVar3 = Tile::getpix(&this->drawing,_dir,local_28);
        if (*puVar3 == 0) {
          puVar3 = Tile::getpix(&this->drawing,_dir,local_28);
          *puVar3 = 0x102030;
        }
      }
    }
    for (t0._4_4_ = 0; t0._4_4_ < 2; t0._4_4_ = t0._4_4_ + 1) {
      if ((*(byte *)((long)&delayTime + (long)t0._4_4_ + 6) & 1) != 0) {
        this->pulcount[t0._4_4_] = this->pulcount[t0._4_4_] + 1;
        lVar5 = clk - this->oclk[t0._4_4_];
        lVar4 = this->oclk[t0._4_4_] - this->ooclk[t0._4_4_];
        if (this->MAXT <= lVar5) {
          this->killax[t0._4_4_] = false;
        }
        if (lVar5 < 1) {
          if (this->fault == 0) {
            this->fault = t0._4_4_ + 2;
            this->faultclk = clk;
          }
          this->killax[t0._4_4_] = true;
        }
        else {
          if (((lVar5 < this->MAXT) || (lVar4 < this->MAXT)) &&
             ((-1 < this->ooclk[t0._4_4_] &&
              ((uint)(*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != this->odir[t0._4_4_])
              ))) {
            if (this->fault == 0) {
              this->fault = t0._4_4_ + 4;
              this->faultclk = clk;
            }
            this->killax[t0._4_4_] = true;
          }
          if (((lVar5 < this->MINT) && (-1 < this->oclk[t0._4_4_])) && (this->fault == 0)) {
            this->fault = t0._4_4_ + 6;
            this->faultclk = clk;
          }
          if (((lVar5 <= this->MAXT) && (lVar4 <= this->MAXT)) &&
             ((-1 < this->ooclk[t0._4_4_] &&
              (((double)(lVar5 + lVar4) * (double)lVar5 * (double)lVar4 * (double)this->MAXACC <=
                ABS((double)(lVar4 - lVar5)) * (double)this->CLKFRQ * (double)this->CLKFRQ * 2.0 &&
               (this->killax[t0._4_4_] = true, this->fault == 0)))))) {
            this->fault = t0._4_4_ + 8;
            this->faultclk = clk;
          }
          if ((this->killax[t0._4_4_] & 1U) == 0) {
            if (this->MINPOS <
                (int)(this->acur[t0._4_4_] +
                      (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 + -1))
            {
              local_7c = this->acur[t0._4_4_] +
                         (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 +
                         -1;
            }
            else {
              local_7c = this->MINPOS;
            }
            if (local_7c < this->MAXPOS) {
              if (this->MINPOS <
                  (int)(this->acur[t0._4_4_] +
                        (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 + -1
                       )) {
                local_80 = this->acur[t0._4_4_] +
                           (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 +
                           -1;
              }
              else {
                local_80 = this->MINPOS;
              }
              local_84 = local_80;
            }
            else {
              local_84 = this->MAXPOS;
            }
            this->acur[t0._4_4_] = local_84;
          }
          if (this->MINPOS <
              (int)(this->cur[t0._4_4_] +
                    (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 + -1)) {
            local_88 = this->cur[t0._4_4_] +
                       (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 + -1;
          }
          else {
            local_88 = this->MINPOS;
          }
          if (local_88 < this->MAXPOS) {
            if (this->MINPOS <
                (int)(this->cur[t0._4_4_] +
                      (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 + -1))
            {
              local_8c = this->cur[t0._4_4_] +
                         (uint)((*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1) != 0) * 2 +
                         -1;
            }
            else {
              local_8c = this->MINPOS;
            }
            local_90 = local_8c;
          }
          else {
            local_90 = this->MAXPOS;
          }
          this->cur[t0._4_4_] = local_90;
          this->ooclk[t0._4_4_] = this->oclk[t0._4_4_];
          this->oclk[t0._4_4_] = clk;
          this->odir[t0._4_4_] = (uint)(*(byte *)((long)&delayTime + (long)t0._4_4_ + 4) & 1);
        }
      }
    }
    this->odown = down;
  }
  return;
}

Assistant:

void Simulator::setpin(std::int64_t clk, bool pulx, bool puly,
                       bool dirx, bool diry, bool down) {
    int x, y;
    bool pul[]{pulx, puly};
    bool dir[]{dirx, diry};

    /* Advance in time */
    if (clk < pclk || (clk==pclk && !pulx && !puly)) {
        app->delay(15);
        return;
    }
    // delay
    static std::uint32_t startTime = 0; // ms
    static std::uint64_t startClk = 0; // tick
    double delayTime = 0; // ms (for sub ms accuracy)
    if ((clk-startClk) > (CLKFRQ/10)) { // handle delay every 100 ms emulated time
        std::uint32_t elapsedTime = app->getTime() - startTime;
        delayTime += static_cast<double>((clk-startClk))*1000.0/TIME_SCALE/CLKFRQ;
        std::uint32_t delayTimeFloor = static_cast<std::uint32_t>(delayTime);
        if (delayTimeFloor > elapsedTime) {
            app->delay(delayTimeFloor-elapsedTime);
            delayTime -= delayTimeFloor;
        } else {
            delayTime = 0;
        }
        startClk = clk;
        startTime = app->getTime();
    }
    pclk = clk;

    /* Log data */
    if (fifn < FIFMAX) {
        fifclk[fifn] = clk;
        fifcurx[fifn] = acur[0];
        fifcury[fifn] = acur[1];
        fifbit[fifn] = pulx + (puly<<1) + (dirx<<2) + (diry<<3) + (down<<4);
        fifn++;
    }

    /* Draw previous pen location */
    x = (acur[0]>>6)+(BMPXRES>>1);
    y = (acur[1]>>6)+(BMPYRES>>1);
    if (((unsigned)x < (unsigned)BMPXRES)
    && ((unsigned)y < (unsigned)BMPYRES)) {
        if (down) {
            drawing.getpix(x, y) = DOWN_COLOR;
        }
        else if (drawing.getpix(x, y) == BACKGROUND_COLOR) {
            drawing.getpix(x, y) = UP_COLOR;
        }
    }

    /* Move pen and apply restriction*/
    for(int i = 0; i < 2; i++) {
        if (!pul[i]) {continue;}
#if ENABLE_RESTRICTION
        pulcount[i]++;
        std::int64_t t0 = clk - oclk[i];
        std::int64_t t1 = oclk[i] - ooclk[i];

        // Unlock axis after slowing down
        if (t0 >= MAXT) {killax[i] = false;}

        // Fault 2/3: zero clk between pulses
        if (t0 <= 0) {
            if (!fault) {fault = i+2; faultclk = clk;}
            killax[i] = 1; continue;
        }

        // Fault 4/5: change direction at high speed
        if (((t0 < MAXT) || (t1 < MAXT)) && (ooclk[i] >= 0) && (dir[i] != odir[i])) {
            if (!fault) {fault = i+4; faultclk = clk; }
            killax[i] = 1;
        }

        // Fault 6/7: speeding
        if ((t0 < MINT) && (oclk[i] >= 0)) {
            if (!fault) {fault = i+6; faultclk = clk;}
        }

        // Fault 8/9: over-acceleration
        if ((t0 <= MAXT) && (t1 <= MAXT) && (ooclk[i] >= 0)) {
            if (fabs((double)(t1-t0))*CLKFRQ*CLKFRQ*2.0 >= (double)(t0+t1)*t0*t1*MAXACC) {
                killax[i] = 1;
                if (!fault) {fault = i+8; faultclk = clk; }
            }
        }

        if (!killax[i]) {
            acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
        }
#else
        acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
#endif // ENABLE_RESTRICTION

        cur[i] = min(max(cur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);

        ooclk[i] = oclk[i];
        oclk[i] = clk;
        odir[i] = dir[i];
    }
    odown = down;
}